

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

prf_state_t * prf_state_create(void)

{
  prf_state_t *state_00;
  prf_node_t **pppVar1;
  matrix4x4_f32_t **ppaafVar2;
  void *__ptr;
  matrix4x4_f32_t *paafVar3;
  matrix4x4_f32_t *m;
  prf_state_t *state;
  void *in_stack_fffffffffffffff8;
  
  state_00 = (prf_state_t *)malloc(0x88);
  if (state_00 != (prf_state_t *)0x0) {
    pppVar1 = (prf_node_t **)prf_array_init((int)((ulong)state_00 >> 0x20),(int)state_00);
    state_00->materials = pppVar1;
    if (state_00->materials == (prf_node_t **)0x0) {
      free(state_00);
      state_00 = (prf_state_t *)0x0;
    }
    else {
      pppVar1 = (prf_node_t **)prf_array_init((int)((ulong)state_00 >> 0x20),(int)state_00);
      state_00->textures = pppVar1;
      if (state_00->textures == (prf_node_t **)0x0) {
        prf_array_free((void *)0x105d43);
        free(state_00);
        state_00 = (prf_state_t *)0x0;
      }
      else {
        pppVar1 = (prf_node_t **)prf_array_init((int)((ulong)state_00 >> 0x20),(int)state_00);
        state_00->instances = pppVar1;
        if (state_00->instances == (prf_node_t **)0x0) {
          prf_array_free((void *)0x105d90);
          prf_array_free((void *)0x105d9e);
          free(state_00);
        }
        ppaafVar2 = (matrix4x4_f32_t **)prf_array_init((int)((ulong)state_00 >> 0x20),(int)state_00)
        ;
        state_00->matrix = ppaafVar2;
        if (state_00->matrix == (matrix4x4_f32_t **)0x0) {
          prf_array_free((void *)0x105ddd);
          prf_array_free((void *)0x105deb);
          prf_array_free((void *)0x105df9);
          free(state_00);
          state_00 = (prf_state_t *)0x0;
        }
        else {
          __ptr = malloc(0x40);
          if (__ptr == (void *)0x0) {
            prf_array_free((void *)0x105e34);
            prf_array_free((void *)0x105e42);
            prf_array_free((void *)0x105e50);
            prf_array_free((void *)0x105e5e);
            free(state_00);
            state_00 = (prf_state_t *)0x0;
          }
          else {
            ppaafVar2 = (matrix4x4_f32_t **)prf_array_append_ptr(m,in_stack_fffffffffffffff8);
            state_00->matrix = ppaafVar2;
            paafVar3 = (matrix4x4_f32_t *)malloc(0x40);
            state_00->inv_matrix = paafVar3;
            if (state_00->inv_matrix == (matrix4x4_f32_t *)0x0) {
              free(__ptr);
              prf_array_free((void *)0x105ecd);
              prf_array_free((void *)0x105edb);
              prf_array_free((void *)0x105ee9);
              prf_array_free((void *)0x105ef7);
              free(state_00);
              state_00 = (prf_state_t *)0x0;
            }
            else {
              prf_state_reset(state_00);
            }
          }
        }
      }
    }
  }
  return state_00;
}

Assistant:

prf_state_t *
prf_state_create(
    void )
{
    prf_state_t * state;
    state = (prf_state_t *)malloc( sizeof( prf_state_t ) );
    if ( state != NULL ) {
        matrix4x4_f32_t * m;
        state->materials = (prf_node_t **)prf_array_init( 4, sizeof( prf_node_t * ) );
        if ( state->materials == NULL ) {
            free( state );
            return NULL;
        }
	state->textures = (prf_node_t **)prf_array_init(4,sizeof(prf_node_t*));
	if ( state->textures == NULL ) {
	    prf_array_free( state->materials );
            free( state );
            return NULL;
	} 

	state->instances=(prf_node_t **)prf_array_init(4,sizeof(prf_node_t*));
	if ( state->instances == NULL ) {
	  prf_array_free( state->materials );
	  prf_array_free( state->textures );
	  free( state );
	}
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_init( 14, sizeof( matrix4x4_f32_t *) );
        if ( state->matrix == NULL ) {
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            free( state );
            return NULL;
        }

        m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t )  );
        if ( m == NULL ) {
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            prf_array_free( state->matrix );
            free( state );
            return NULL;
        }
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_append_ptr( state->matrix, m );
        state->inv_matrix = 
	  (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
        if ( state->inv_matrix == NULL ) {
            free( m );
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            prf_array_free( state->matrix );
            free( state );
            return NULL;
        }
        prf_state_reset( state );
    }
    return state;
}